

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall UnscentedKalmanFilter_init_Test::TestBody(UnscentedKalmanFilter_init_Test *this)

{
  bool bVar1;
  AssertionResult *this_00;
  AssertHelper *this_01;
  char *in_R9;
  undefined1 local_1f8 [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  AssertionResult gtest_ar__1;
  AssertHelper local_20;
  
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_1f8,1.0,2.0,1.0);
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma,
                     (float *)((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                      super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data + 0x1c));
  this_00 = &gtest_ar_;
  ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)CONCAT31(ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                       array[7]._1_3_,bVar1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    Kalman::UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::UnscentedKalmanFilter
              ((UnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),1.0,2.0,1.0);
    ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
    local_38.data_._0_1_ =
         (internal)
         Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                   ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                    &ukfMatrix.super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     .gamma,(float *)((long)&ukfMatrix.
                                             super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                             .
                                             super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                             .P.
                                             super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data + 0x1c));
    this_00 = &gtest_ar__1;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if ((bool)local_38.data_._0_1_) goto LAB_00187322;
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),(internal *)&local_38,(AssertionResult *)"ukfMatrix.P.isIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0x12,(char *)CONCAT44(ukfMatrix.
                                      super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[8],
                                      ukfMatrix.
                                      super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[7]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ukfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c));
    this_01 = &local_20;
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),(internal *)
                       ((long)&ukfMatrix.
                               super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),(AssertionResult *)"ukf.P.isIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0xe,(char *)CONCAT44(ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[8],
                                     ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[7]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c));
    this_01 = &local_38;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
LAB_00187322:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, init) {
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.P.isIdentity()); // P should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = UnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.P.isIdentity()); // P should be identity
}